

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                     ImGuiWindowClass *window_class)

{
  byte *pbVar1;
  ImVec2 IVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindow *this;
  ImGuiWindow *pIVar5;
  undefined8 uVar6;
  ImGuiContext *ctx;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiID IVar9;
  ImGuiContext *g_1;
  ImGuiDockNode *node;
  uint uVar10;
  ImGuiContext *g;
  float fVar11;
  ImVec2 size;
  char title [256];
  ImVec2 local_148;
  ImVec2 *local_140;
  undefined8 local_138;
  undefined1 uStack_130;
  undefined7 uStack_12f;
  undefined1 uStack_128;
  undefined8 uStack_127;
  
  ctx = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    if (((uint)flags >> 10 & 1) != 0) {
      __assert_fail("(flags & ImGuiDockNodeFlags_DockSpace) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x37d1,
                    "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    local_140 = size_arg;
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x37d2,
                    "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    uVar10 = (uint)this->SkipItems | flags;
    node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,id);
    if (node == (ImGuiDockNode *)0x0) {
      node = DockContextAddNode(ctx,id);
      pbVar1 = (byte *)((long)&node->LocalFlags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    node->SharedFlags = uVar10;
    if (window_class == (ImGuiWindowClass *)0x0) {
      uStack_128 = 0;
      uStack_127 = 0;
      local_138 = 0;
      uStack_130 = 0;
      uStack_12f = 0;
      bVar8 = true;
    }
    else {
      local_138._0_4_ = window_class->ClassId;
      local_138._4_4_ = window_class->ParentViewportId;
      uVar6._0_4_ = window_class->ViewportFlagsOverrideSet;
      uVar6._4_4_ = window_class->ViewportFlagsOverrideClear;
      uStack_127 = *(undefined8 *)((long)&window_class->DockNodeFlagsOverrideSet + 1);
      uStack_128 = (undefined1)
                   ((ulong)*(undefined8 *)((long)&window_class->ViewportFlagsOverrideSet + 1) >>
                   0x38);
      uStack_130 = (undefined1)(undefined4)uVar6;
      uStack_12f = (undefined7)((ulong)uVar6 >> 8);
      bVar8 = window_class->DockingAllowUnclassed;
    }
    *(ulong *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 1) =
         CONCAT17(uStack_128,uStack_12f);
    *(undefined8 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 1) = uStack_127;
    (node->WindowClass).ClassId = (undefined4)local_138;
    (node->WindowClass).ParentViewportId = local_138._4_4_;
    (node->WindowClass).ViewportFlagsOverrideSet = (int)CONCAT71(uStack_12f,uStack_130);
    (node->WindowClass).ViewportFlagsOverrideClear = (int)((uint7)uStack_12f >> 0x18);
    (node->WindowClass).DockingAllowUnclassed = bVar8;
    uVar3 = node->LocalFlags;
    iVar4 = ctx->FrameCount;
    if (((uVar10 & 1) == 0) && (node->LastFrameActive == iVar4)) {
      if ((uVar3 >> 10 & 1) != 0) {
        __assert_fail("node->IsDockSpace() == false && \"Cannot call DockSpace() twice a frame with the same ID\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x37e3,
                      "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                     );
      }
      node->LocalFlags = uVar3 | 0x400;
    }
    else {
      node->LocalFlags = uVar3 | 0x400;
      pIVar7 = GImGui;
      if ((uVar10 & 1) == 0) {
        pIVar5 = GImGui->CurrentWindow;
        IVar2 = (pIVar5->ContentRegionRect).Max;
        fVar11 = IVar2.x;
        if ((pIVar5->DC).CurrentColumns != (ImGuiColumns *)0x0) {
          fVar11 = (pIVar5->WorkRect).Max.x;
        }
        local_148.x = (float)(int)local_140->x;
        local_148.y = (float)(int)local_140->y;
        if ((local_148.x <= 0.0) &&
           (local_148.x = (fVar11 - (pIVar5->DC).CursorPos.x) + local_148.x, local_148.x <= 4.0)) {
          local_148.x = 4.0;
        }
        if ((local_148.y <= 0.0) &&
           (local_148.y = (IVar2.y - (pIVar5->DC).CursorPos.y) + local_148.y, local_148.y <= 4.0)) {
          local_148.y = 4.0;
        }
        if ((local_148.x <= 0.0) || (local_148.y <= 0.0)) {
          __assert_fail("size.x > 0.0f && size.y > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x37f6,
                        "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        node->Pos = (this->DC).CursorPos;
        node->SizeRef = local_148;
        node->Size = local_148;
        uVar10 = (pIVar7->NextWindowData).Flags;
        (pIVar7->NextWindowData).Flags = uVar10 | 1;
        (pIVar7->NextWindowData).PosVal = node->Pos;
        (pIVar7->NextWindowData).PosPivotVal.x = 0.0;
        (pIVar7->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar7->NextWindowData).PosCond = 1;
        (pIVar7->NextWindowData).PosUndock = true;
        (pIVar7->NextWindowData).Flags = uVar10 | 3;
        (pIVar7->NextWindowData).SizeVal = node->Size;
        (pIVar7->NextWindowData).SizeCond = 1;
        (ctx->NextWindowData).PosUndock = false;
        ImFormatString((char *)&local_138,0x100,"%s/DockSpace_%08X",this->Name,id);
        if ((0 < (node->Windows).Size) || (node->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
          PushStyleColor(3,0);
        }
        PushStyleVar(7,0.0);
        Begin((char *)&local_138,(bool *)0x0,0x2100013b);
        PopStyleVar(1);
        if ((0 < (node->Windows).Size) || (node->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
          PopStyleColor(1);
        }
        pIVar5 = ctx->CurrentWindow;
        pIVar5->DockNodeAsHost = node;
        IVar9 = ImGuiWindow::GetID(this,(char *)&local_138,(char *)0x0);
        pIVar5->ChildId = IVar9;
        node->HostWindow = pIVar5;
        node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        if (node->ParentNode != (ImGuiDockNode *)0x0) {
          __assert_fail("node->IsRootNode()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x3815,
                        "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        if ((node->ChildNodes[0] == (ImGuiDockNode *)0x0) &&
           (((uint)node->LocalFlags >> 0xb & 1) == 0)) {
          node->LocalFlags = node->LocalFlags | 0x800;
        }
        DockNodeUpdate(node);
        End();
        ItemSize(&local_148,-1.0);
      }
      else {
        node->LastFrameAlive = iVar4;
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    IM_ASSERT(id != 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;
        return;
    }
    node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK Why do we need a child window to host a dockspace, could we host it in the existing window?
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    // FIXME-DOCK: What is the reason for not simply calling BeginChild()?
    if (node->Windows.Size > 0 || node->IsSplitNode())
        PushStyleColor(ImGuiCol_ChildBg, IM_COL32(0, 0, 0, 0));
    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();
    if (node->Windows.Size > 0 || node->IsSplitNode())
        PopStyleColor();

    ImGuiWindow* host_window = g.CurrentWindow;
    host_window->DockNodeAsHost = node;
    host_window->ChildId = window->GetID(title);
    node->HostWindow = host_window;
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());

    // We need to handle the rare case were a central node is missing.
    // This can happen if the node was first created manually with DockBuilderAddNode() but _without_ the ImGuiDockNodeFlags_Dockspace.
    // Doing it correctly would set the _CentralNode flags, which would then propagate according to subsequent split.
    // It would also be ambiguous to attempt to assign a central node while there are split nodes, so we wait until there's a single node remaining.
    // The specific sub-property of _CentralNode we are interested in recovering here is the "Don't delete when empty" property,
    // as it doesn't make sense for an empty dockspace to not have this property.
    if (node->IsLeafNode() && !node->IsCentralNode())
        node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;

    // Update the node
    DockNodeUpdate(node);

    End();
    ItemSize(size);
}